

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ObjNative * newNative(NativeFn function)

{
  ObjNative *pOVar1;
  NativeFn in_RDI;
  ObjNative *native;
  ObjType in_stack_ffffffffffffffec;
  size_t in_stack_fffffffffffffff0;
  
  pOVar1 = (ObjNative *)allocateObject(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  pOVar1->function = in_RDI;
  return pOVar1;
}

Assistant:

ObjNative *newNative(NativeFn function) {
    ObjNative *native = ALLOCATE_OBJ(ObjNative, OBJ_NATIVE);
    native->function = function;
    return native;
}